

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

ForStatement * __thiscall SQASTReader::readForStatement(SQASTReader *this)

{
  Node *args_1;
  Expr *args_2;
  Expr *args_3;
  ForStatement *pFVar1;
  SQASTReader *in_RDI;
  SQASTReader *unaff_retaddr;
  Statement *body;
  Expr *modifier;
  Expr *condition;
  Node *init;
  SQASTReader *in_stack_ffffffffffffffe8;
  SQASTReader *args;
  
  args = in_RDI;
  args_1 = readNullable(in_stack_ffffffffffffffe8);
  args_2 = readNullableExpression(in_RDI);
  args_3 = readNullableExpression(in_RDI);
  readNullableStatement(in_RDI);
  pFVar1 = newNode<SQCompilation::ForStatement,SQCompilation::Node*,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Statement*>
                     (unaff_retaddr,(Node *)args,(Expr *)args_1,args_2,(Statement *)args_3);
  return pFVar1;
}

Assistant:

ForStatement *SQASTReader::readForStatement() {
  Node *init = readNullable();
  Expr *condition = readNullableExpression();
  Expr *modifier = readNullableExpression();

  Statement *body = readNullableStatement();

  return newNode<ForStatement>(init, condition, modifier, body);
}